

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,LocalSocketState state)

{
  QDebug *this;
  undefined4 in_EDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  QDebugStateSaver saver;
  Stream *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  this = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(this);
  switch(in_EDX) {
  case 0:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  default:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    QDebug::operator<<((QDebug *)this_00,(int)((ulong)in_RDI >> 0x20));
    QDebug::operator<<((QDebug *)this_00,(char)((ulong)in_RDI >> 0x38));
    break;
  case 2:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 3:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 6:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
  }
  QDebug::QDebug((QDebug *)this_00,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QLocalSocket::LocalSocketState state)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (state) {
    case QLocalSocket::UnconnectedState:
        debug << "QLocalSocket::UnconnectedState";
        break;
    case QLocalSocket::ConnectingState:
        debug << "QLocalSocket::ConnectingState";
        break;
    case QLocalSocket::ConnectedState:
        debug << "QLocalSocket::ConnectedState";
        break;
    case QLocalSocket::ClosingState:
        debug << "QLocalSocket::ClosingState";
        break;
    default:
        debug << "QLocalSocket::SocketState(" << int(state) << ')';
        break;
    }
    return debug;
}